

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O1

void VP8IteratorSetRow(VP8EncIterator *it,int y)

{
  VP8Encoder *pVVar1;
  uint8_t *puVar2;
  ulong uVar3;
  
  pVVar1 = it->enc_;
  it->x_ = 0;
  it->y_ = y;
  uVar3 = (ulong)y;
  it->bw_ = pVVar1->parts_ + ((long)pVVar1->num_parts_ - 1U & uVar3);
  it->preds_ = pVVar1->preds_ + (long)pVVar1->preds_w_ * uVar3 * 4;
  it->nz_ = pVVar1->nz_;
  it->mb_ = pVVar1->mb_info_ + (long)pVVar1->mb_w_ * uVar3;
  puVar2 = pVVar1->uv_top_;
  it->y_top_ = pVVar1->y_top_;
  it->uv_top_ = puVar2;
  InitLeft(it);
  return;
}

Assistant:

void VP8IteratorSetRow(VP8EncIterator* const it, int y) {
  VP8Encoder* const enc = it->enc_;
  it->x_ = 0;
  it->y_ = y;
  it->bw_ = &enc->parts_[y & (enc->num_parts_ - 1)];
  it->preds_ = enc->preds_ + y * 4 * enc->preds_w_;
  it->nz_ = enc->nz_;
  it->mb_ = enc->mb_info_ + y * enc->mb_w_;
  it->y_top_ = enc->y_top_;
  it->uv_top_ = enc->uv_top_;
  InitLeft(it);
}